

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::PrintPresetVariables(cmake *this)

{
  _Rb_tree_header *p_Var1;
  CacheEntryType type;
  undefined8 in_RAX;
  ostream *poVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  char local_41;
  uint local_40;
  char local_39;
  cmake *local_38;
  
  p_Var4 = (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    local_40 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_38 = this;
    do {
      if ((char)p_Var4[4]._M_color == _S_black) {
        if (p_Var4[2]._M_parent == (_Base_ptr)0x0) {
          type = UNINITIALIZED;
        }
        else {
          type = cmState::StringToCacheEntryType((string *)(p_Var4 + 2));
        }
        if ((local_40 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Preset CMake variables:\n\n",0x19);
          local_40 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        if (type != UNINITIALIZED) {
          local_41 = ':';
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,&local_41,1);
          psVar3 = cmState::CacheEntryTypeToString_abi_cxx11_(type);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=\"",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var4 + 3),(long)p_Var4[3]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      this = local_38;
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    if ((local_40 & 1) == 0) {
      local_39 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_39,1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::clear(&(this->UnprocessedPresetVariables)._M_t);
  return;
}

Assistant:

void cmake::PrintPresetVariables()
{
  bool first = true;
  for (auto const& var : this->UnprocessedPresetVariables) {
    if (!var.second) {
      continue;
    }
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (!var.second->Type.empty()) {
      type = cmState::StringToCacheEntryType(var.second->Type);
    }
    if (first) {
      std::cout << "Preset CMake variables:\n\n";
      first = false;
    }
    std::cout << "  " << var.first;
    if (type != cmStateEnums::UNINITIALIZED) {
      std::cout << ':' << cmState::CacheEntryTypeToString(type);
    }
    std::cout << "=\"" << var.second->Value << "\"\n";
  }
  if (!first) {
    std::cout << '\n';
  }
  this->UnprocessedPresetVariables.clear();
}